

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileProfilingData.cxx
# Opt level: O2

void __thiscall
cmMakefileProfilingData::StartEntry
          (cmMakefileProfilingData *this,string *category,string *name,optional<Json::Value> *args)

{
  StreamWriter *pSVar1;
  long lVar2;
  Value *pVVar3;
  longlong lVar4;
  Value v;
  SystemInformation info;
  Value VStack_a8;
  Value local_78;
  SystemInformation local_48 [4];
  
  if (*(int *)(&(this->ProfileStream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x20
              + (long)(this->ProfileStream).super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream[-3]) == 0) {
    lVar2 = std::ostream::tellp();
    if (1 < lVar2) {
      std::operator<<((ostream *)this,",");
    }
    cmsys::SystemInformation::SystemInformation(local_48);
    Json::Value::Value(&local_78,nullValue);
    Json::Value::Value(&VStack_a8,"B");
    pVVar3 = Json::Value::operator[](&local_78,"ph");
    Json::Value::operator=(pVVar3,&VStack_a8);
    Json::Value::~Value(&VStack_a8);
    Json::Value::Value(&VStack_a8,name);
    pVVar3 = Json::Value::operator[](&local_78,"name");
    Json::Value::operator=(pVVar3,&VStack_a8);
    Json::Value::~Value(&VStack_a8);
    Json::Value::Value(&VStack_a8,category);
    pVVar3 = Json::Value::operator[](&local_78,"cat");
    Json::Value::operator=(pVVar3,&VStack_a8);
    Json::Value::~Value(&VStack_a8);
    lVar2 = std::chrono::_V2::steady_clock::now();
    Json::Value::Value(&VStack_a8,lVar2 / 1000);
    pVVar3 = Json::Value::operator[](&local_78,"ts");
    Json::Value::operator=(pVVar3,&VStack_a8);
    Json::Value::~Value(&VStack_a8);
    lVar4 = cmsys::SystemInformation::GetProcessId(local_48);
    Json::Value::Value(&VStack_a8,(Int)lVar4);
    pVVar3 = Json::Value::operator[](&local_78,"pid");
    Json::Value::operator=(pVVar3,&VStack_a8);
    Json::Value::~Value(&VStack_a8);
    Json::Value::Value(&VStack_a8,0);
    pVVar3 = Json::Value::operator[](&local_78,"tid");
    Json::Value::operator=(pVVar3,&VStack_a8);
    Json::Value::~Value(&VStack_a8);
    if ((args->super__Optional_base<Json::Value,_false,_false>)._M_payload.
        super__Optional_payload<Json::Value,_true,_false,_false>.
        super__Optional_payload_base<Json::Value>._M_engaged == true) {
      pVVar3 = Json::Value::operator[](&local_78,"args");
      Json::Value::operator=(pVVar3,(Value *)args);
    }
    pSVar1 = (this->JsonWriter)._M_t.
             super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>.
             _M_t.
             super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>.
             super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl;
    (*pSVar1->_vptr_StreamWriter[2])(pSVar1,&local_78,this);
    Json::Value::~Value(&local_78);
    cmsys::SystemInformation::~SystemInformation(local_48);
  }
  return;
}

Assistant:

void cmMakefileProfilingData::StartEntry(const std::string& category,
                                         const std::string& name,
                                         cm::optional<Json::Value> args)
{
  /* Do not try again if we previously failed to write to output. */
  if (!this->ProfileStream.good()) {
    return;
  }

  try {
    if (this->ProfileStream.tellp() > 1) {
      this->ProfileStream << ",";
    }
    cmsys::SystemInformation info;
    Json::Value v;
    v["ph"] = "B";
    v["name"] = name;
    v["cat"] = category;
    v["ts"] = static_cast<Json::Value::UInt64>(
      std::chrono::duration_cast<std::chrono::microseconds>(
        std::chrono::steady_clock::now().time_since_epoch())
        .count());
    v["pid"] = static_cast<int>(info.GetProcessId());
    v["tid"] = 0;
    if (args) {
      v["args"] = *std::move(args);
    }

    this->JsonWriter->write(v, &this->ProfileStream);
  } catch (std::ios_base::failure& fail) {
    cmSystemTools::Error(
      cmStrCat("Failed to write to profiling output: ", fail.what()));
  } catch (...) {
    cmSystemTools::Error("Error writing profiling output!");
  }
}